

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  type tVar1;
  size_t sVar2;
  char *__result;
  size_t new_size;
  char *end_local;
  char *begin_local;
  buffer<char> *this_local;
  
  sVar2 = this->size_;
  tVar1 = to_unsigned<long>((long)end - (long)begin);
  sVar2 = sVar2 + tVar1;
  reserve(this,sVar2);
  __result = make_checked<char>(this->ptr_ + this->size_,this->capacity_ - this->size_);
  std::uninitialized_copy<char_const*,char*>(begin,end,__result);
  this->size_ = sVar2;
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end,
                          make_checked(ptr_ + size_, capacity_ - size_));
  size_ = new_size;
}